

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_color_hsva_i(int *out_h,int *out_s,int *out_v,int *out_a,nk_color in)

{
  float a;
  float v;
  float s;
  float h;
  float local_4c;
  uint *local_48;
  float local_3c;
  float local_38;
  float local_34;
  
  local_48 = (uint *)out_a;
  nk_color_hsva_f(&local_34,&local_38,&local_3c,&local_4c,in);
  *out_h = (int)(local_34 * 255.0) & 0xff;
  *out_s = (int)(local_38 * 255.0) & 0xff;
  *out_v = (int)(local_3c * 255.0) & 0xff;
  *local_48 = (int)(local_4c * 255.0) & 0xff;
  return;
}

Assistant:

NK_API void
nk_color_hsva_i(int *out_h, int *out_s, int *out_v,
                int *out_a, struct nk_color in)
{
    float h,s,v,a;
    nk_color_hsva_f(&h, &s, &v, &a, in);
    *out_h = (nk_byte)(h * 255.0f);
    *out_s = (nk_byte)(s * 255.0f);
    *out_v = (nk_byte)(v * 255.0f);
    *out_a = (nk_byte)(a * 255.0f);
}